

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O3

void __thiscall IZDeflate::init_desc(IZDeflate *this)

{
  (this->l_desc).extra_bits = this->extra_lbits;
  (this->d_desc).extra_bits = this->extra_dbits;
  (this->bl_desc).extra_bits = this->extra_blbits;
  (this->l_desc).dyn_tree = this->dyn_ltree;
  (this->d_desc).dyn_tree = this->dyn_dtree;
  (this->bl_desc).dyn_tree = this->bl_tree;
  (this->l_desc).static_tree = this->static_ltree;
  (this->d_desc).static_tree = this->static_dtree;
  (this->bl_desc).static_tree = (ct_data *)0x0;
  return;
}

Assistant:

void IZDeflate::init_desc() {
  //l_desc = {dyn_ltree, static_ltree, extra_lbits, LITERALS+1, L_CODES, MAX_BITS, 0};
  //d_desc = {dyn_dtree, static_dtree, extra_dbits, 0,          D_CODES, MAX_BITS, 0};
  //bl_desc = {bl_tree, NULL,       extra_blbits, 0,         BL_CODES, MAX_BL_BITS, 0};
  l_desc.extra_bits = extra_lbits;
  d_desc.extra_bits = extra_dbits;
  bl_desc.extra_bits = extra_blbits;

  l_desc.dyn_tree = dyn_ltree;
  d_desc.dyn_tree = dyn_dtree;
  bl_desc.dyn_tree = bl_tree;

  l_desc.static_tree = static_ltree;
  d_desc.static_tree = static_dtree;
  bl_desc.static_tree = NULL;

}